

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O3

size_t duckdb_zstd::ZSTD_compressStream
                 (ZSTD_CStream *zcs,ZSTD_outBuffer *output,ZSTD_inBuffer *input)

{
  size_t sVar1;
  
  sVar1 = ZSTD_compressStream2(zcs,output,input,ZSTD_e_continue);
  if (sVar1 < 0xffffffffffffff89) {
    if ((zcs->appliedParams).inBufferMode == ZSTD_bm_stable) {
      sVar1 = zcs->blockSize - zcs->stableIn_notConsumed;
    }
    else {
      sVar1 = zcs->inBuffTarget - zcs->inBuffPos;
      if (sVar1 == 0) {
        sVar1 = zcs->blockSize;
      }
    }
  }
  return sVar1;
}

Assistant:

size_t ZSTD_compressStream(ZSTD_CStream* zcs, ZSTD_outBuffer* output, ZSTD_inBuffer* input)
{
    FORWARD_IF_ERROR( ZSTD_compressStream2(zcs, output, input, ZSTD_e_continue) , "");
    return ZSTD_nextInputSizeHint_MTorST(zcs);
}